

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.h
# Opt level: O2

uint64_t __thiscall namedlabels::get(namedlabels *this,substring *s)

{
  unsigned_long uVar1;
  uint64_t hash;
  unsigned_long *puVar2;
  ostream *poVar3;
  char *pcVar4;
  
  hash = uniform_hash(s->begin,(long)s->end - (long)s->begin,0x5c621);
  puVar2 = v_hashmap<substring,_unsigned_long>::get(&this->name2id,s,hash);
  uVar1 = *puVar2;
  if (uVar1 == 0) {
    std::operator<<((ostream *)&std::cerr,"warning: missing named label \'");
    for (pcVar4 = s->begin; pcVar4 != s->end; pcVar4 = pcVar4 + 1) {
      std::operator<<((ostream *)&std::cerr,*pcVar4);
    }
    poVar3 = std::operator<<((ostream *)&std::cerr,'\'');
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  return uVar1;
}

Assistant:

uint64_t get(substring& s)
  {
    uint64_t hash = uniform_hash((unsigned char*)s.begin, s.end - s.begin, 378401);
    uint64_t v = name2id.get(s, hash);
    if (v == 0)
    {
      std::cerr << "warning: missing named label '";
      for (char* c = s.begin; c != s.end; c++) std::cerr << *c;
      std::cerr << '\'' << std::endl;
    }
    return v;
  }